

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLScanner::scanReset(XMLScanner *this,XMLPScanToken *token)

{
  bool bVar1;
  RuntimeException *this_00;
  XMLPScanToken *token_local;
  XMLScanner *this_local;
  
  bVar1 = isLegalToken(this,token);
  if (!bVar1) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
               ,0x27f,Scan_BadPScanToken,this->fMemoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  ReaderMgr::reset(&this->fReaderMgr);
  this->fSequenceId = this->fSequenceId + 1;
  this->fErrorCount = 0;
  return;
}

Assistant:

void XMLScanner::scanReset(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Reset the reader manager
    fReaderMgr.reset();

    // And invalidate any tokens by bumping our sequence number
    fSequenceId++;

    // Reset our error count
    fErrorCount = 0;
}